

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoch_tracker.cc
# Opt level: O2

void __thiscall sptk::reaper::EpochTracker::DoDynamicProgramming(EpochTracker *this)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  int *piVar6;
  pointer pRVar7;
  ulong uVar8;
  pointer pfVar9;
  size_t fhyp;
  ulong uVar10;
  ulong uVar11;
  size_t phyp;
  ulong uVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  
  pRVar7 = (this->resid_peaks_).
           super__Vector_base<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar11 = 0;
  do {
    if ((ulong)(((long)(this->resid_peaks_).
                       super__Vector_base<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar7) / 0x70) <= uVar11)
    {
      return;
    }
    if (*(pointer *)
         ((long)&pRVar7[uVar11].past.
                 super__Vector_base<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
                 ._M_impl + 8) !=
        *(pointer *)
         &pRVar7[uVar11].past.
          super__Vector_base<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
          ._M_impl) {
      for (uVar10 = 0;
          lVar3 = *(long *)&pRVar7[uVar11].future.
                            super__Vector_base<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
                            ._M_impl,
          uVar10 < (ulong)((long)*(pointer *)
                                  ((long)&pRVar7[uVar11].future.
                                          super__Vector_base<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
                                          ._M_impl + 8) - lVar3 >> 3); uVar10 = uVar10 + 1) {
        iVar1 = **(int **)(lVar3 + uVar10 * 8);
        uVar8 = 0;
        fVar15 = 1e+30;
        uVar12 = 0;
        while( true ) {
          lVar3 = *(long *)&pRVar7[uVar11].past.
                            super__Vector_base<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
                            ._M_impl;
          lVar4 = *(long *)(*(long *)&pRVar7[uVar11].future.
                                      super__Vector_base<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
                                      ._M_impl + uVar10 * 8);
          if ((ulong)((long)*(pointer *)
                             ((long)&pRVar7[uVar11].past.
                                     super__Vector_base<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
                                     ._M_impl + 8) - lVar3 >> 3) <= uVar12) break;
          piVar6 = *(int **)(lVar3 + uVar12 * 8);
          if (*(char *)(lVar4 + 0x1c) == '\x01') {
            if ((char)piVar6[7] == '\0') {
              fVar14 = this->voice_transition_factor_;
              iVar2 = pRVar7[uVar11].frame_index;
              pfVar9 = (this->voice_onset_prob_).super__Vector_base<float,_std::allocator<float>_>.
                       _M_impl.super__Vector_impl_data._M_start;
LAB_0010d570:
              fVar14 = (1.0 - pfVar9[iVar2]) * fVar14;
            }
            else {
              fVar14 = this->freq_trans_wt_;
              fVar13 = logf((float)iVar1 / (float)*piVar6);
              fVar14 = ABS(fVar13) * fVar14;
              pRVar7 = (this->resid_peaks_).
                       super__Vector_base<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              piVar6 = *(int **)(*(long *)&pRVar7[uVar11].past.
                                           super__Vector_base<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
                                           ._M_impl + uVar12 * 8);
            }
            fVar14 = fVar14 + (float)piVar6[2];
          }
          else {
            if ((char)piVar6[7] != '\0') {
              fVar14 = this->voice_transition_factor_;
              iVar2 = pRVar7[uVar11].frame_index;
              pfVar9 = (this->voice_offset_prob_).super__Vector_base<float,_std::allocator<float>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              goto LAB_0010d570;
            }
            fVar14 = (float)piVar6[2];
          }
          uVar5 = uVar12;
          if (fVar15 <= fVar14) {
            fVar14 = fVar15;
            uVar5 = uVar8;
          }
          uVar8 = uVar5;
          fVar15 = fVar14;
          uVar12 = uVar12 + 1;
        }
        *(float *)(lVar4 + 8) = fVar15 + *(float *)(lVar4 + 4);
        *(int *)(lVar4 + 0x14) = (int)uVar8;
      }
    }
    uVar11 = uVar11 + 1;
  } while( true );
}

Assistant:

void EpochTracker::DoDynamicProgramming(void) {
  // Perform the dynamic programming iterations over all pulses in
  // the residual.
  // For each pulse in the residual....
  for (size_t peak = 0; peak < resid_peaks_.size(); ++peak) {
    if (resid_peaks_[peak].past.size() == 0) {  // Is this peak an origin?
      continue;
    }
    // For each forward period hypothesis starting at this pulse...
    for (size_t fhyp = 0; fhyp < resid_peaks_[peak].future.size(); ++fhyp) {
      float min_cost = 1.0e30;  //  huge
      size_t min_index = 0;
      float forward_period =  resid_peaks_[peak].future[fhyp]->period;
      // For each of the previous period hyps ending on this pulse...
      for (size_t phyp = 0; phyp < resid_peaks_[peak].past.size(); ++phyp) {
        float sum_cost = 0.0;
        // There are 4 voicing hyps to consider: V->V  V->UV  UV->V  UV->UV
        if (resid_peaks_[peak].future[fhyp]->voiced &&
            resid_peaks_[peak].past[phyp]->voiced) {  // v->v
          float f_trans_cost = freq_trans_wt_ *
              fabs(log(forward_period / resid_peaks_[peak].past[phyp]->period));
          sum_cost = f_trans_cost + resid_peaks_[peak].past[phyp]->cost_sum;
        } else {
          if (resid_peaks_[peak].future[fhyp]->voiced &&
              !resid_peaks_[peak].past[phyp]->voiced) {  // uv->v
            float v_transition_cost = voice_transition_factor_ *
                (1.0 - voice_onset_prob_[resid_peaks_[peak].frame_index]);
            sum_cost = resid_peaks_[peak].past[phyp]->cost_sum +
                v_transition_cost;
          } else {
            if ((!resid_peaks_[peak].future[fhyp]->voiced) &&
                resid_peaks_[peak].past[phyp]->voiced) {  // v->uv
              float v_transition_cost = voice_transition_factor_ *
                  (1.0 - voice_offset_prob_[resid_peaks_[peak].frame_index]);
              sum_cost = resid_peaks_[peak].past[phyp]->cost_sum +
                  v_transition_cost;
            } else {  //  UV->UV
              sum_cost = resid_peaks_[peak].past[phyp]->cost_sum;
            }
          }
        }
        if (sum_cost < min_cost) {
          min_cost = sum_cost;
          min_index = phyp;
        }
      }  // end for each previous period hyp
      resid_peaks_[peak].future[fhyp]->cost_sum =
          resid_peaks_[peak].future[fhyp]->local_cost + min_cost;
      resid_peaks_[peak].future[fhyp]->best_prev_cand = min_index;
    }  // end for each foreward period hyp
  }  // end for each pulse in the residual signal.
  // Here ends the dynamic programming.
}